

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress,CNetAddr,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>,int>
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s,CAddress *args,
               CNetAddr *args_1,
               Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
               *args_2,int *args_3)

{
  HashedSourceWriter<AutoFile> *this;
  Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
  *__n;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __n = args_2;
  CAddress::
  SerializationOps<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress_const,ActionSerialize>
            (args,s);
  CNetAddr::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(args_1,s);
  Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>
  ::Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
            ((Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>
              *)args_2,s);
  local_2c = *args_3;
  this = s->m_substream;
  AutoFile::write(this->m_source,(int)&local_2c,(void *)0x4,(size_t)__n);
  CSHA256::Write((CSHA256 *)this,(uchar *)&local_2c,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}